

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O3

void predict_or_learn<false,true,false,false>(oaa *o,single_learner *base,example *ec)

{
  float fVar1;
  int iVar2;
  _func_void_int_string_v_array<char> *p_Var3;
  undefined4 uVar4;
  undefined4 uVar5;
  size_t sVar6;
  v_array<char> vVar7;
  uint64_t uVar8;
  ostream *poVar9;
  ulong uVar10;
  uint uVar11;
  float fVar12;
  ulong uVar13;
  features *this;
  size_t sVar14;
  polyprediction *ppVar15;
  stringstream outputStringStream;
  undefined1 in_stack_fffffffffffffe08 [15];
  char in_stack_fffffffffffffe17;
  float fVar16;
  uint uVar17;
  size_t in_stack_fffffffffffffe20;
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  uVar17 = (ec->l).multi.label;
  fVar16 = (ec->l).simple.weight;
  if (((ulong)uVar17 == 0) || ((uVar17 != 0xffffffff && (o->k < (ulong)uVar17)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"label ",6);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," is not in {1,",0xe);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"} This won\'t work right.",0x18);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  sVar14 = o->k;
  ppVar15 = o->pred;
  if (*(code **)(base + 0x40) == (code *)0x0) {
    in_stack_fffffffffffffe20 = sVar14;
    if (sVar14 == 0) {
      uVar8 = (ec->super_example_predict).ft_offset;
    }
    else {
      do {
        (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        fVar12 = (ec->pred).scalar;
        fVar1 = *(float *)((long)&ec->pred + 4);
        uVar4 = *(undefined4 *)((long)&ec->pred + 8);
        uVar5 = *(undefined4 *)((long)&ec->pred + 0xc);
        sVar6 = (ec->pred).scalars.erase_count;
        (ppVar15->scalars).end_array = (ec->pred).scalars.end_array;
        (ppVar15->scalars).erase_count = sVar6;
        ppVar15->scalar = fVar12;
        *(float *)((long)&(ppVar15->scalars)._begin + 4) = fVar1;
        *(undefined4 *)&(ppVar15->scalars)._end = uVar4;
        *(undefined4 *)((long)&(ppVar15->scalars)._end + 4) = uVar5;
        uVar8 = (ulong)*(uint *)(base + 0xe0) + (ec->super_example_predict).ft_offset;
        (ec->super_example_predict).ft_offset = uVar8;
        ppVar15 = ppVar15 + 1;
        sVar14 = sVar14 - 1;
      } while (sVar14 != 0);
    }
    uVar8 = uVar8 - (uint)((int)in_stack_fffffffffffffe20 * *(int *)(base + 0xe0));
  }
  else {
    (**(code **)(base + 0x40))
              (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec,sVar14,
               *(undefined8 *)(base + 0xe0),ppVar15,1);
    uVar8 = (ec->super_example_predict).ft_offset;
  }
  (ec->super_example_predict).ft_offset = uVar8;
  uVar10 = o->k;
  fVar12 = 1.4013e-45;
  if (1 < uVar10) {
    fVar12 = 1.4013e-45;
    uVar11 = 3;
    do {
      fVar1 = o->pred[uVar11 - 2].scalar;
      ppVar15 = o->pred + ((int)fVar12 - 1);
      if (ppVar15->scalar <= fVar1 && fVar1 != ppVar15->scalar) {
        fVar12 = (float)(uVar11 - 1);
      }
      uVar13 = (ulong)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar13 <= uVar10);
  }
  this = ec->passthrough;
  if (uVar10 != 0 && this != (features *)0x0) {
    uVar13 = 1;
    uVar11 = 2;
    while( true ) {
      if (this != (features *)0x0) {
        features::push_back(this,o->pred[uVar11 - 2].scalar,uVar13 ^ 0x398d9fda640553);
        uVar10 = o->k;
      }
      uVar13 = (ulong)uVar11;
      if (uVar10 < uVar13) break;
      this = ec->passthrough;
      uVar11 = uVar11 + 1;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"1:",2);
  std::ostream::_M_insert<double>((double)o->pred->scalar);
  if (1 < o->k) {
    uVar11 = 3;
    do {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,&stack0xfffffffffffffe17,1);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      in_stack_fffffffffffffe17 = ':';
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,&stack0xfffffffffffffe17,1);
      std::ostream::_M_insert<double>((double)o->pred[uVar11 - 2].scalar);
      uVar10 = (ulong)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar10 <= o->k);
  }
  p_Var3 = o->all->print_text;
  iVar2 = o->all->raw_prediction;
  std::__cxx11::stringbuf::str();
  vVar7._end._7_1_ = in_stack_fffffffffffffe17;
  vVar7._0_15_ = in_stack_fffffffffffffe08;
  vVar7.end_array._0_4_ = fVar16;
  vVar7.end_array._4_4_ = uVar17;
  vVar7.erase_count = in_stack_fffffffffffffe20;
  (*p_Var3)(iVar2,(string)ec->tag,vVar7);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  (ec->pred).scalar = fVar12;
  (ec->l).multi.label = uVar17;
  (ec->l).simple.weight = fVar16;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void predict_or_learn(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t mc_label_data = ec.l.multi;
  if (mc_label_data.label == 0 || (mc_label_data.label > o.k && mc_label_data.label != (uint32_t)-1))
    cout << "label " << mc_label_data.label << " is not in {1," << o.k << "} This won't work right." << endl;

  stringstream outputStringStream;
  uint32_t prediction = 1;
  v_array<float> scores_array;
  if (scores)
    scores_array = ec.pred.scalars;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  base.multipredict(ec, 0, o.k, o.pred, true);
  for (uint32_t i = 2; i <= o.k; i++)
    if (o.pred[i - 1].scalar > o.pred[prediction - 1].scalar)
      prediction = i;

  if (ec.passthrough)
    for (uint32_t i = 1; i <= o.k; i++) add_passthrough_feature(ec, i, o.pred[i - 1].scalar);

  if (is_learn)
  {
    for (uint32_t i = 1; i <= o.k; i++)
    {
      ec.l.simple = {(mc_label_data.label == i) ? 1.f : -1.f, 0.f, 0.f};
      ec.pred.scalar = o.pred[i - 1].scalar;
      base.update(ec, i - 1);
    }
  }

  if (print_all)
  {
    outputStringStream << "1:" << o.pred[0].scalar;
    for (uint32_t i = 2; i <= o.k; i++) outputStringStream << ' ' << i << ':' << o.pred[i - 1].scalar;
    o.all->print_text(o.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (scores)
  {
    scores_array.clear();
    for (uint32_t i = 0; i < o.k; i++) scores_array.push_back(o.pred[i].scalar);
    ec.pred.scalars = scores_array;

    if (probabilities)
    {
      float sum_prob = 0;
      for (uint32_t i = 0; i < o.k; i++)
      {
        ec.pred.scalars[i] = 1.f / (1.f + correctedExp(-o.pred[i].scalar));
        sum_prob += ec.pred.scalars[i];
      }
      float inv_sum_prob = 1.f / sum_prob;
      for (uint32_t i = 0; i < o.k; i++) ec.pred.scalars[i] *= inv_sum_prob;
    }
  }
  else
    ec.pred.multiclass = prediction;

  ec.l.multi = mc_label_data;
}